

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O3

int op_get_more(lua_State *L)

{
  uint8_t *__src;
  lua_Integer lVar1;
  char *key;
  lua_Integer lVar2;
  char *pcVar3;
  uint8_t *puVar4;
  int iVar5;
  size_t __n;
  int iVar6;
  size_t sz;
  size_t cursor_len;
  buffer local_d0;
  size_t local_40;
  size_t local_38;
  
  lVar1 = luaL_checkinteger(L,1);
  local_40 = 0;
  key = luaL_checklstring(L,2,&local_40);
  lVar2 = luaL_checkinteger(L,3);
  local_38 = 0;
  pcVar3 = luaL_tolstring(L,4,&local_38);
  if (local_38 != 8) {
    luaL_error(L,"Invalid cursor id");
  }
  __src = local_d0.buffer;
  local_d0.buffer[4] = (uint8_t)lVar1;
  local_d0.buffer[5] = (uint8_t)((ulong)lVar1 >> 8);
  local_d0.buffer[6] = (uint8_t)((ulong)lVar1 >> 0x10);
  local_d0.buffer[7] = (uint8_t)((ulong)lVar1 >> 0x18);
  local_d0.buffer[8] = '\0';
  local_d0.buffer[9] = '\0';
  local_d0.buffer[10] = '\0';
  local_d0.buffer[0xb] = '\0';
  local_d0.buffer[0xc] = 0xd5;
  local_d0.buffer[0xd] = '\a';
  local_d0.buffer[0xe] = '\0';
  local_d0.buffer[0xf] = '\0';
  local_d0.buffer[0x10] = '\0';
  local_d0.buffer[0x11] = '\0';
  local_d0.buffer[0x12] = '\0';
  local_d0.buffer[0x13] = '\0';
  local_d0.size = 0x14;
  local_d0.cap = 0x80;
  local_d0.ptr = __src;
  write_string(&local_d0,key,local_40);
  iVar6 = local_d0.size;
  puVar4 = local_d0.ptr;
  if (local_d0.cap < local_d0.size + 4) {
    __n = (size_t)local_d0.size;
    do {
      local_d0.cap = local_d0.cap * 2;
    } while (local_d0.cap <= local_d0.size + 4);
    if (local_d0.ptr == __src) {
      puVar4 = (uint8_t *)malloc((long)local_d0.cap);
      local_d0.ptr = puVar4;
      memcpy(puVar4,__src,__n);
    }
    else {
      local_d0.ptr = (uint8_t *)realloc(local_d0.ptr,(long)local_d0.cap);
      puVar4 = local_d0.ptr;
      iVar6 = local_d0.size;
    }
  }
  puVar4[iVar6] = (uint8_t)lVar2;
  local_d0.ptr[iVar6 + 1] = (uint8_t)((ulong)lVar2 >> 8);
  local_d0.ptr[iVar6 + 2] = (uint8_t)((ulong)lVar2 >> 0x10);
  iVar5 = iVar6 + 4;
  local_d0.ptr[iVar6 + 3] = (uint8_t)((ulong)lVar2 >> 0x18);
  puVar4 = local_d0.ptr;
  local_d0.size = iVar5;
  if (local_d0.cap < iVar6 + 0xc) {
    do {
      local_d0.cap = local_d0.cap * 2;
    } while (local_d0.cap <= iVar6 + 0xc);
    if (local_d0.ptr == __src) {
      puVar4 = (uint8_t *)malloc((long)local_d0.cap);
      local_d0.ptr = puVar4;
      memcpy(puVar4,__src,(long)iVar5);
    }
    else {
      local_d0.ptr = (uint8_t *)realloc(local_d0.ptr,(long)local_d0.cap);
      puVar4 = local_d0.ptr;
      iVar5 = local_d0.size;
    }
  }
  *(undefined8 *)(puVar4 + iVar5) = *(undefined8 *)pcVar3;
  local_d0.size = local_d0.size + 8;
  *local_d0.ptr = (uint8_t)local_d0.size;
  local_d0.ptr[1] = (uint8_t)((uint)local_d0.size >> 8);
  local_d0.ptr[2] = (uint8_t)((uint)local_d0.size >> 0x10);
  local_d0.ptr[3] = (uint8_t)((uint)local_d0.size >> 0x18);
  lua_pushlstring(L,(char *)local_d0.ptr,(long)local_d0.size);
  if (local_d0.ptr != __src) {
    free(local_d0.ptr);
  }
  return 1;
}

Assistant:

static int
op_get_more(lua_State *L) {
	int id = luaL_checkinteger(L, 1);
	size_t sz = 0;
	const char * name = luaL_checklstring(L,2,&sz);
	int number = luaL_checkinteger(L, 3);
	size_t cursor_len = 0;
	const char * cursor_id = luaL_tolstring(L, 4, &cursor_len);
	if (cursor_len != 8) {
		return luaL_error(L, "Invalid cursor id");
	}

	struct buffer buf;
	buffer_create(&buf);
		int len = reserve_length(&buf);
		write_int32(&buf, id);
		write_int32(&buf, 0);
		write_int32(&buf, OP_GET_MORE);
		write_int32(&buf, 0);
		write_string(&buf, name, sz);
		write_int32(&buf, number);
		write_bytes(&buf, cursor_id, 8);
		write_length(&buf, buf.size, len);

		lua_pushlstring(L, (const char *)buf.ptr, buf.size);
	buffer_destroy(&buf);

	return 1;
}